

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,OpAccInst *i)

{
  Reg RVar1;
  Reg RVar2;
  OpCode OVar3;
  Reg RVar4;
  _Head_base<0UL,_arm::Inst_*,_false> local_50;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_48;
  VarId local_40;
  
  if (i->op == MulShAdd) {
    local_48 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst;
    local_40.id = (i->super_Inst).dest.id;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    RVar1 = get_or_alloc_vgp(this,&local_40);
    RVar2 = translate_value_to_reg(this,&i->lhs);
    OVar3 = translate_value_to_reg(this,&i->rhs);
    local_40.id = (i->acc).id;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    RVar4 = get_or_alloc_vgp(this,&local_40);
    local_50._M_head_impl = (Inst *)operator_new(0x20);
    (local_50._M_head_impl)->op = SMMla;
    (local_50._M_head_impl)->cond = Always;
    ((local_50._M_head_impl)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f08c8;
    *(Reg *)&local_50._M_head_impl[1].super_Displayable._vptr_Displayable = RVar1;
    *(Reg *)((long)&local_50._M_head_impl[1].super_Displayable._vptr_Displayable + 4) = RVar2;
    local_50._M_head_impl[1].op = OVar3;
    *(Reg *)&local_50._M_head_impl[1].cond = RVar4;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              (local_48,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_50);
  }
  else {
    if (i->op != MulAdd) {
      return;
    }
    local_48 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst;
    local_40.id = (i->super_Inst).dest.id;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    RVar1 = get_or_alloc_vgp(this,&local_40);
    RVar2 = translate_value_to_reg(this,&i->lhs);
    OVar3 = translate_value_to_reg(this,&i->rhs);
    local_40.id = (i->acc).id;
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    RVar4 = get_or_alloc_vgp(this,&local_40);
    local_50._M_head_impl = (Inst *)operator_new(0x20);
    (local_50._M_head_impl)->op = Mla;
    (local_50._M_head_impl)->cond = Always;
    ((local_50._M_head_impl)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001f08c8;
    *(Reg *)&local_50._M_head_impl[1].super_Displayable._vptr_Displayable = RVar1;
    *(Reg *)((long)&local_50._M_head_impl[1].super_Displayable._vptr_Displayable + 4) = RVar2;
    local_50._M_head_impl[1].op = OVar3;
    *(Reg *)&local_50._M_head_impl[1].cond = RVar4;
    std::
    vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
    ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
              (local_48,(unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)&local_50);
  }
  if (local_50._M_head_impl != (Inst *)0x0) {
    (*((local_50._M_head_impl)->super_Displayable)._vptr_Displayable[2])();
  }
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::OpAccInst& i) {
  switch (i.op) {
    case mir::inst::OpAcc::MulAdd:
      inst.push_back(std::make_unique<Arith4Inst>(
          arm::OpCode::Mla, translate_var_reg(i.dest),
          translate_value_to_reg(i.lhs), translate_value_to_reg(i.rhs),
          translate_var_reg(i.acc)));
      break;
    case mir::inst::OpAcc::MulShAdd:
      inst.push_back(std::make_unique<Arith4Inst>(
          arm::OpCode::SMMla, translate_var_reg(i.dest),
          translate_value_to_reg(i.lhs), translate_value_to_reg(i.rhs),
          translate_var_reg(i.acc)));
      break;
  }
}